

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

void slang::
     function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
     ::
     callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__1>
               (intptr_t callable,char params,unsigned_long params_1,unsigned_long params_2,
               FormatOptions *params_3)

{
  SymbolKind SVar1;
  undefined8 *puVar2;
  Expression *this;
  ASTContext *this_00;
  Type *this_01;
  bool bVar3;
  uint uVar4;
  bitwidth_t bVar5;
  Diagnostic *pDVar6;
  Type *pTVar7;
  int __c;
  undefined7 in_register_00000031;
  byte bVar8;
  SourceLocation SVar9;
  SourceLocation SVar10;
  SourceRange sourceRange;
  SourceRange range;
  SourceRange range_00;
  
  __c = (int)CONCAT71(in_register_00000031,params);
  uVar4 = tolower(__c);
  if ((uVar4 & 0xfe) == 0x6c) {
    return;
  }
  SVar10 = (SourceLocation)(params_1 * 0x10000000 + *(long *)**(undefined8 **)callable);
  SVar9 = (SourceLocation)((params_2 + params_1) * 0x10000000 + *(long *)**(undefined8 **)callable);
  puVar2 = (undefined8 *)**(long **)(callable + 8);
  if (puVar2 == (undefined8 *)**(long **)(callable + 0x10)) {
    sourceRange.endLoc = SVar9;
    sourceRange.startLoc = SVar10;
    pDVar6 = ast::ASTContext::addDiag
                       (*(ASTContext **)(callable + 0x18),(DiagCode)0x12000b,sourceRange);
    Diagnostic::operator<<(pDVar6,params);
LAB_004187b2:
    **(undefined1 **)(callable + 0x20) = 0;
    return;
  }
  **(long **)(callable + 8) = (long)(puVar2 + 1);
  this = (Expression *)*puVar2;
  this_00 = *(ASTContext **)(callable + 0x18);
  if (this->kind == EmptyArgument) {
    pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x10000b,this->sourceRange);
    pDVar6 = Diagnostic::operator<<(pDVar6,params);
    range.endLoc = SVar9;
    range.startLoc = SVar10;
    Diagnostic::operator<<(pDVar6,range);
    goto LAB_004187b2;
  }
  bVar3 = ast::Expression::bad(this);
  if (bVar3) {
    bVar8 = 0;
    goto LAB_004188de;
  }
  this_01 = (this->type).ptr;
  uVar4 = tolower(__c);
  switch(uVar4 & 0xff) {
  case 0x62:
  case 99:
  case 100:
  case 0x68:
  case 0x6f:
  case 0x78:
    bVar3 = ast::Type::isIntegral(this_01);
    bVar8 = 1;
    if (bVar3) goto LAB_004188de;
    pTVar7 = this_01->canonical;
    if (pTVar7 == (Type *)0x0) {
      ast::Type::resolveCanonical(this_01);
      pTVar7 = this_01->canonical;
    }
    SVar1 = (pTVar7->super_Symbol).kind;
    if (SVar1 == StringType) goto LAB_004188de;
    if (SVar1 == FloatingType) {
      pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x2d000b,this->sourceRange);
      pDVar6 = Diagnostic::operator<<(pDVar6,params);
      goto LAB_0041886f;
    }
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x74:
    bVar3 = ast::Type::isNumeric(this_01);
    goto LAB_00418896;
  case 0x70:
    pTVar7 = this_01->canonical;
    if (pTVar7 == (Type *)0x0) {
      ast::Type::resolveCanonical(this_01);
      pTVar7 = this_01->canonical;
    }
    bVar8 = 1;
    if ((pTVar7->super_Symbol).kind != VoidType) goto LAB_004188de;
    break;
  case 0x73:
    bVar3 = ast::Type::canBeStringLike(this_01);
    goto LAB_00418896;
  case 0x75:
  case 0x7a:
    bVar3 = ast::isValidForRaw(this_01);
LAB_00418896:
    bVar8 = 1;
    if (bVar3 != false) goto LAB_004188de;
    break;
  case 0x76:
    bVar3 = ast::Type::isIntegral(this_01);
    if (!bVar3) break;
    bVar5 = ast::Type::getBitWidth(this_01);
    bVar8 = 1;
    if (bVar5 < 2) goto LAB_004188de;
    pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x2c000b,this->sourceRange);
LAB_0041886f:
    bVar8 = 1;
    goto LAB_004188d0;
  }
  pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x11000b,this->sourceRange);
  pDVar6 = ast::operator<<(pDVar6,this_01);
  pDVar6 = Diagnostic::operator<<(pDVar6,params);
  bVar8 = 0;
LAB_004188d0:
  range_00.endLoc = SVar9;
  range_00.startLoc = SVar10;
  Diagnostic::operator<<(pDVar6,range_00);
LAB_004188de:
  **(byte **)(callable + 0x20) = **(byte **)(callable + 0x20) & bVar8;
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }